

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void R_DrawHeightPlanes(double height)

{
  double dVar1;
  TAngle<double> local_40;
  DAngle oViewAngle;
  DVector3 oViewPos;
  visplane_t *pvStack_18;
  int i;
  visplane_t *pl;
  double height_local;
  
  ds_color = 3;
  TVector3<double>::TVector3((TVector3<double> *)&oViewAngle,&ViewPos);
  TAngle<double>::TAngle(&local_40,&ViewAngle);
  for (oViewPos.Z._4_4_ = 0; oViewPos.Z._4_4_ < 0x80; oViewPos.Z._4_4_ = oViewPos.Z._4_4_ + 1) {
    for (pvStack_18 = visplanes[oViewPos.Z._4_4_]; pvStack_18 != (visplane_t *)0x0;
        pvStack_18 = pvStack_18->next) {
      if (((pvStack_18->CurrentSkybox == CurrentSkybox) &&
          (pvStack_18->CurrentPortalUniq == CurrentPortalUniq)) && (pvStack_18->sky < 0)) {
        dVar1 = secplane_t::Zat0(&pvStack_18->height);
        if ((dVar1 == height) && (!NAN(dVar1) && !NAN(height))) {
          TVector3<double>::operator=(&ViewPos,&pvStack_18->viewpos);
          TAngle<double>::operator=(&ViewAngle,&pvStack_18->viewangle);
          MirrorFlags = (WORD)pvStack_18->MirrorFlags;
          R_DrawSinglePlane(pvStack_18,pvStack_18->sky & 0x7fffffff,(bool)(pvStack_18->Additive & 1)
                            ,true);
        }
      }
    }
  }
  TVector3<double>::operator=(&ViewPos,(TVector3<double> *)&oViewAngle);
  TAngle<double>::operator=(&ViewAngle,&local_40);
  return;
}

Assistant:

void R_DrawHeightPlanes(double height)
{
	visplane_t *pl;
	int i;

	ds_color = 3;

	DVector3 oViewPos = ViewPos;
	DAngle oViewAngle = ViewAngle;

	for (i = 0; i < MAXVISPLANES; i++)
	{
		for (pl = visplanes[i]; pl; pl = pl->next)
		{
			// kg3D - draw only correct planes
			if(pl->CurrentSkybox != CurrentSkybox || pl->CurrentPortalUniq != CurrentPortalUniq)
				continue;
			if(pl->sky < 0 && pl->height.Zat0() == height) {
				ViewPos = pl->viewpos;
				ViewAngle = pl->viewangle;
				MirrorFlags = pl->MirrorFlags;
				R_DrawSinglePlane (pl, pl->sky & 0x7FFFFFFF, pl->Additive, true);
			}
		}
	}
	ViewPos = oViewPos;
	ViewAngle = oViewAngle;
}